

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O3

void __thiscall flow::util::Flags::Error::Error(Error *this,ErrorCode code,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288;
  undefined8 uStack_280;
  long local_278 [2];
  long *local_268;
  undefined8 uStack_260;
  pointer local_258;
  size_type sStack_250;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  FlagsErrorCategory::get();
  (**(code **)((long)FlagsErrorCategory::get::cat + 0x20))
            (&local_288,&FlagsErrorCategory::get::cat,code);
  local_268 = local_288;
  uStack_260 = uStack_280;
  local_258 = (arg->_M_dataplus)._M_p;
  sStack_250 = arg->_M_string_length;
  local_238 = 0;
  local_248 = &PTR_grow_0019b370;
  local_230 = 500;
  format_str.size_ = 6;
  format_str.data_ = "{}: {}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_268;
  args.types_ = 0xbb;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str,args);
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a8,local_240,local_240 + local_238);
  local_248 = &PTR_grow_0019b370;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_2a8);
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  *(undefined ***)this = &PTR__Error_0019d588;
  this->code_ = code;
  paVar1 = &(this->arg_).field_2;
  (this->arg_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (arg->_M_dataplus)._M_p;
  paVar2 = &arg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&arg->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->arg_).field_2 + 8) = uVar4;
  }
  else {
    (this->arg_)._M_dataplus._M_p = pcVar3;
    (this->arg_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->arg_)._M_string_length = arg->_M_string_length;
  (arg->_M_dataplus)._M_p = (pointer)paVar2;
  arg->_M_string_length = 0;
  (arg->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

Flags::Error::Error(ErrorCode code, std::string arg)
    : std::runtime_error{fmt::format("{}: {}", 
          FlagsErrorCategory::get().message(static_cast<int>(code)), arg)},
      code_{code},
      arg_{std::move(arg)} {
}